

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidgetPrivate::releaseResources(QRhiWidgetPrivate *this)

{
  QRhiWidgetPrivate *in_RDI;
  
  resetRenderTargetObjects(in_RDI);
  resetColorBufferObjects(in_RDI);
  qDeleteAll<QList<QRhiResource*>>((QList<QRhiResource_*> *)in_RDI);
  QList<QRhiResource_*>::clear((QList<QRhiResource_*> *)in_RDI);
  return;
}

Assistant:

void QRhiWidgetPrivate::releaseResources()
{
    resetRenderTargetObjects();
    resetColorBufferObjects();
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();
}